

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O0

bool __thiscall gnilk::IPCResultSummary::Marshal(IPCResultSummary *this,IPCEncoderBase *encoder)

{
  bool bVar1;
  size_type sVar2;
  reference ppIVar3;
  undefined8 extraout_RDX;
  IPCTestResults **tr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_> *__range1;
  IPCEncoderBase *encoder_local;
  IPCResultSummary *this_local;
  
  (*(encoder->super_IPCWriter)._vptr_IPCWriter[3])(encoder,0x80);
  (*(encoder->super_IPCWriter)._vptr_IPCWriter[9])(encoder,(ulong)(uint)this->testsExecuted);
  (*(encoder->super_IPCWriter)._vptr_IPCWriter[9])(encoder,(ulong)(uint)this->testsFailed);
  (*(encoder->super_IPCWriter)._vptr_IPCWriter[0x10])(this->durationSec);
  sVar2 = std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>::size
                    (&this->testResults);
  (*(encoder->super_IPCWriter)._vptr_IPCWriter[5])(encoder,sVar2 & 0xffff,extraout_RDX,(short)sVar2)
  ;
  __end1 = std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>::begin
                     (&this->testResults);
  tr = (IPCTestResults **)
       std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>::end
                 (&this->testResults);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<gnilk::IPCTestResults_*const_*,_std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>_>
                      (&__end1,(__normal_iterator<gnilk::IPCTestResults_*const_*,_std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>_>
                                *)&tr);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppIVar3 = __gnu_cxx::
              __normal_iterator<gnilk::IPCTestResults_*const_*,_std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>_>
              ::operator*(&__end1);
    (*((*ppIVar3)->super_IPCSerializer)._vptr_IPCSerializer[2])(*ppIVar3,encoder);
    __gnu_cxx::
    __normal_iterator<gnilk::IPCTestResults_*const_*,_std::vector<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>_>
    ::operator++(&__end1);
  }
  (*(encoder->super_IPCWriter)._vptr_IPCWriter[6])();
  (*(encoder->super_IPCWriter)._vptr_IPCWriter[4])();
  return true;
}

Assistant:

bool IPCResultSummary::Marshal(gnilk::IPCEncoderBase &encoder) const {

    encoder.BeginObject(kMsgType_ResultSummary);
    encoder.WriteI32(testsExecuted);
    encoder.WriteI32(testsFailed);
    encoder.WriteDouble(durationSec);
    encoder.BeginArray(testResults.size());
    for (auto &tr : testResults) {
        tr->Marshal(encoder);
    }
    encoder.EndArray();
    encoder.EndObject();
    return true;
}